

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<4,_12,_12>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  float *pfVar2;
  Vector<float,_3> *pVVar3;
  long lVar4;
  undefined4 *puVar5;
  Vector<float,_3> *b;
  long lVar6;
  Vector<float,_3> *pVVar7;
  long lVar8;
  undefined8 *puVar9;
  int col;
  undefined4 uVar10;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Mat4x3 m_1;
  Mat4x3 m;
  float afStack_d8 [6];
  float local_c0 [4];
  float local_b0 [2];
  ulong local_a8;
  undefined4 local_a0;
  Matrix<float,_3,_4> local_98;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  Matrix<float,_3,_4> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &local_68;
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar8 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar4 != lVar8) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar8) = uVar10;
        lVar8 = lVar8 + 0xc;
      } while (lVar8 != 0x30);
      lVar6 = lVar6 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar4 = lVar4 + 0xc;
    } while (lVar6 != 3);
    local_68 = *(undefined8 *)evalCtx->in[0].m_data;
    local_58 = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    uStack_60 = CONCAT44(evalCtx->in[1].m_data[0],evalCtx->in[0].m_data[2]);
    uStack_50 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_40 = *(undefined8 *)(evalCtx->in[3].m_data + 1);
    local_48 = CONCAT44(evalCtx->in[3].m_data[0],evalCtx->in[2].m_data[2]);
  }
  else {
    puVar1 = &local_68;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    puVar5 = &s_constInMat4x3;
    lVar4 = 0;
    do {
      lVar6 = 0;
      puVar9 = puVar1;
      do {
        *(undefined4 *)puVar9 = puVar5[lVar6];
        lVar6 = lVar6 + 1;
        puVar9 = (undefined8 *)((long)puVar9 + 0xc);
      } while (lVar6 != 4);
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar5 = puVar5 + 4;
    } while (lVar4 != 3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pfVar2 = (float *)&local_98;
    b = (Vector<float,_3> *)0x0;
    lVar4 = 0;
    do {
      pVVar3 = (Vector<float,_3> *)0x0;
      do {
        uVar10 = 0x3f800000;
        if (b != pVVar3) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)pfVar2 + (long)pVVar3) = uVar10;
        pVVar3 = pVVar3 + 1;
      } while (pVVar3 != (Vector<float,_3> *)0x30);
      lVar4 = lVar4 + 1;
      pfVar2 = pfVar2 + 1;
      b = (((Matrix<float,_3,_4> *)b)->m_data).m_data + 1;
    } while (lVar4 != 3);
    local_98.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_98.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    local_98.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_98.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_98.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_98.m_data.m_data[3].m_data._4_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 1);
    local_98.m_data.m_data[3].m_data[0] = evalCtx->in[3].m_data[0];
    local_98.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  }
  else {
    pVVar3 = (Vector<float,_3> *)&local_98;
    local_98.m_data.m_data[2].m_data[2] = 0.0;
    local_98.m_data.m_data[3].m_data[0] = 0.0;
    local_98.m_data.m_data[3].m_data[1] = 0.0;
    local_98.m_data.m_data[3].m_data[2] = 0.0;
    local_98.m_data.m_data[1].m_data[1] = 0.0;
    local_98.m_data.m_data[1].m_data[2] = 0.0;
    local_98.m_data.m_data[2].m_data[0] = 0.0;
    local_98.m_data.m_data[2].m_data[1] = 0.0;
    local_98.m_data.m_data[0].m_data[0] = 0.0;
    local_98.m_data.m_data[0].m_data[1] = 0.0;
    local_98.m_data.m_data[0].m_data[2] = 0.0;
    local_98.m_data.m_data[1].m_data[0] = 0.0;
    b = (Vector<float,_3> *)&DAT_00ae3e30;
    lVar4 = 0;
    do {
      lVar6 = 0;
      pVVar7 = pVVar3;
      do {
        ((Vector<tcu::Vector<float,_3>,_4> *)pVVar7->m_data)->m_data[0].m_data[0] = b->m_data[lVar6]
        ;
        lVar6 = lVar6 + 1;
        pVVar7 = pVVar7 + 1;
      } while (lVar6 != 4);
      lVar4 = lVar4 + 1;
      pVVar3 = (Vector<float,_3> *)(pVVar3->m_data + 1);
      b = (Vector<float,_3> *)(b[1].m_data + 1);
    } while (lVar4 != 3);
  }
  matrixCompMult<float,3,4>
            (&local_38,(MatrixCaseUtils *)&local_68,&local_98,(Matrix<float,_3,_4> *)b);
  local_c0[2] = 0.0;
  local_c0[0] = 0.0;
  local_c0[1] = 0.0;
  lVar4 = 0;
  do {
    local_c0[lVar4] =
         local_38.m_data.m_data[0].m_data[lVar4] + local_38.m_data.m_data[1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_a8 = local_a8 & 0xffffffff00000000;
  local_b0[0] = 0.0;
  local_b0[1] = 0.0;
  lVar4 = 0;
  do {
    local_b0[lVar4] = local_c0[lVar4] + local_38.m_data.m_data[2].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  afStack_d8[4] = 0.0;
  afStack_d8[2] = 0.0;
  afStack_d8[3] = 0.0;
  lVar4 = 0;
  do {
    afStack_d8[lVar4 + 2] = local_b0[lVar4] + local_38.m_data.m_data[3].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_a8 = 0x100000000;
  local_a0 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)local_b0[lVar4]] = afStack_d8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}